

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

void Vec_WecUnmarkLevels(Vec_Wec_t *vCubes,Vec_Int_t *vLevels)

{
  int iVar1;
  Vec_Int_t *vVec;
  int local_24;
  int i;
  Vec_Int_t *vCube;
  Vec_Int_t *vLevels_local;
  Vec_Wec_t *vCubes_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vLevels);
    if (iVar1 <= local_24) {
      return;
    }
    iVar1 = Vec_IntEntry(vLevels,local_24);
    vVec = Vec_WecEntry(vCubes,iVar1);
    iVar1 = Vec_WecIntHasMark(vVec);
    if (iVar1 == 0) break;
    Vec_WecIntXorMark(vVec);
    local_24 = local_24 + 1;
  }
  __assert_fail("Vec_WecIntHasMark( vCube )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x2c0,"void Vec_WecUnmarkLevels(Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

static inline void Vec_WecUnmarkLevels( Vec_Wec_t * vCubes, Vec_Int_t * vLevels )
{
    Vec_Int_t * vCube;
    int i;
    Vec_WecForEachLevelVec( vLevels, vCubes, vCube, i )
    {
        assert( Vec_WecIntHasMark( vCube ) );
        Vec_WecIntXorMark( vCube );
    }
}